

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof_data.c
# Opt level: O2

void duckdb_je_prof_reset(tsd_t *tsd,size_t lg_sample)

{
  prof_tdata_t **pppVar1;
  byte *pbVar2;
  undefined8 *puVar3;
  prof_tdata_t *ppVar4;
  prof_tdata_t *ppVar5;
  void *pvVar6;
  int iVar7;
  ulong *puVar8;
  long lVar9;
  rtree_ctx_t *prVar10;
  prof_tdata_t *ppVar11;
  ulong uVar12;
  uintptr_t key;
  malloc_mutex_t *rtree_ctx;
  tsd_t *tsd_00;
  prof_tdata_t *in_R8;
  prof_tdata_t *ppVar13;
  ulong uVar14;
  undefined8 *puVar15;
  long *plVar16;
  prof_tdata_tree_t pVar17;
  rtree_t *prVar18;
  rtree_metadata_t rVar19;
  rtree_contents_t rStack_848;
  base_t *pbStack_830;
  rtree_node_elm_t rStack_28;
  
  malloc_mutex_lock((tsdn_t *)tsd,&duckdb_je_prof_dump_mtx);
  rtree_ctx = &duckdb_je_tdatas_mtx;
  tsd_00 = tsd;
  malloc_mutex_lock((tsdn_t *)tsd,&duckdb_je_tdatas_mtx);
  rStack_28.child.repr = (atomic_p_t)(atomic_p_t)tsd;
  puVar15 = (undefined8 *)&stack0xfffffffffffff7e0;
  pbStack_830 = (base_t *)tdatas.rbt_root;
  pVar17 = tdatas;
  while (pVar17.rbt_root != (prof_tdata_t *)0x0) {
    iVar7 = prof_tdata_comp((prof_tdata_t *)rtree_ctx,pVar17.rbt_root);
    *(int *)(puVar15 + -1) = iVar7;
    if (-1 < iVar7) {
      pVar17.rbt_root = ((pVar17.rbt_root)->tdata_link).rbn_right_red & 0xfffffffffffffffe;
      *puVar15 = pVar17.rbt_root;
      if (iVar7 != 0) goto LAB_00e7197b;
      *(undefined4 *)(puVar15 + -1) = 1;
      puVar8 = puVar15 + -2;
      while (pVar17.rbt_root != (prof_tdata_t *)0x0) {
        *(undefined4 *)(puVar15 + 1) = 0xffffffff;
        pVar17.rbt_root = ((pVar17.rbt_root)->tdata_link).rbn_left;
        puVar15[2] = pVar17.rbt_root;
        puVar15 = puVar15 + 2;
      }
      goto LAB_00e71987;
    }
    pVar17.rbt_root = ((pVar17.rbt_root)->tdata_link).rbn_left;
    *puVar15 = pVar17.rbt_root;
LAB_00e7197b:
    puVar15 = puVar15 + 2;
  }
  puVar15 = puVar15 + -2;
  puVar8 = (ulong *)0x0;
LAB_00e71987:
  puVar3 = puVar15 + -2;
  prVar10 = (rtree_ctx_t *)puVar15[-2];
  if (prVar10 == (rtree_ctx_t *)rtree_ctx) {
    pVar17.rbt_root = (prof_tdata_t *)((rtree_ctx_t *)rtree_ctx)->cache[1].leaf;
    if (pVar17.rbt_root != (prof_tdata_t *)0x0) {
      pppVar1 = &((pVar17.rbt_root)->tdata_link).rbn_right_red;
      *(byte *)pppVar1 = *(byte *)pppVar1 & 0xfe;
      if ((base_t **)puVar3 != &stack0xfffffffffffff7d0) {
        if (*(int *)(puVar15 + -3) < 0) {
          lVar9 = puVar15[-4];
LAB_00e71d26:
          *(prof_tdata_t **)(lVar9 + 0x18) = pVar17.rbt_root;
          pVar17 = tdatas;
        }
        else {
          lVar9 = puVar15[-4];
LAB_00e71d12:
          *(ulong *)(lVar9 + 0x20) =
               (ulong)((uint)*(undefined8 *)(lVar9 + 0x20) & 1) | (ulong)pVar17.rbt_root;
          pVar17 = tdatas;
        }
      }
      goto LAB_00e71d9d;
    }
    if ((base_t **)puVar3 == &stack0xfffffffffffff7d0) {
      tdatas.rbt_root = (prof_tdata_t *)0x0;
      pVar17.rbt_root = tdatas.rbt_root;
      goto LAB_00e71d9d;
    }
  }
  else {
    uVar12 = prVar10->cache[2].leafkey;
    in_R8 = (prof_tdata_t *)(ulong)((uint)((rtree_ctx_t *)rtree_ctx)->cache[2].leafkey & 1);
    prVar10->cache[2].leafkey = uVar12 & 0xfffffffffffffffe | (ulong)in_R8;
    prVar10->cache[1].leaf = ((rtree_ctx_t *)rtree_ctx)->cache[1].leaf;
    prVar10->cache[2].leafkey =
         ((rtree_ctx_t *)rtree_ctx)->cache[2].leafkey & 0xfffffffffffffffe | (ulong)in_R8;
    ((rtree_ctx_t *)rtree_ctx)->cache[2].leafkey =
         ((rtree_ctx_t *)rtree_ctx)->cache[2].leafkey & 0xfffffffffffffffe |
         (ulong)((uint)uVar12 & 1);
    *puVar8 = (ulong)prVar10;
    *puVar3 = rtree_ctx;
    prVar10 = (rtree_ctx_t *)rtree_ctx;
    if ((base_t **)puVar8 == &stack0xfffffffffffff7d0) {
      tdatas.rbt_root = (prof_tdata_t *)*puVar8;
    }
    else if ((int)puVar8[-1] < 0) {
      *(ulong *)(puVar8[-2] + 0x18) = *puVar8;
    }
    else {
      *(ulong *)(puVar8[-2] + 0x20) =
           (ulong)((uint)*(undefined8 *)(puVar8[-2] + 0x20) & 1) | *puVar8;
    }
  }
  if ((prVar10->cache[2].leafkey & 1) == 0) {
    puVar15[-2] = 0;
    for (plVar16 = puVar15 + -6; puVar8 = (ulong *)(plVar16 + 2),
        pVar17.rbt_root = (prof_tdata_t *)pbStack_830, &stack0xfffffffffffff7d0 <= puVar8;
        plVar16 = plVar16 + -2) {
      in_R8 = (prof_tdata_t *)plVar16[4];
      if (-1 < (int)plVar16[3]) {
        uVar12 = *puVar8;
        pVar17.rbt_root = *(prof_tdata_t **)(uVar12 + 0x18);
        uVar14 = (ulong)((uint)*(undefined8 *)(uVar12 + 0x20) & 1);
        *(ulong *)(uVar12 + 0x20) = uVar14 | (ulong)in_R8;
        ppVar4 = ((pVar17.rbt_root)->tdata_link).rbn_right_red;
        ppVar13 = pVar17.rbt_root;
        if (((ulong)ppVar4 & 1) == 0) {
          if (uVar14 == 0 && ((ulong)in_R8 & 1) == 0) {
            in_R8 = ((pVar17.rbt_root)->tdata_link).rbn_left;
            if ((in_R8 == (prof_tdata_t *)0x0) ||
               (ppVar11 = (in_R8->tdata_link).rbn_right_red, ((ulong)ppVar11 & 1) == 0)) {
              ((pVar17.rbt_root)->tdata_link).rbn_right_red = (prof_tdata_t *)((ulong)ppVar4 | 1);
              goto LAB_00e71b47;
            }
            (in_R8->tdata_link).rbn_right_red =
                 (prof_tdata_t *)((ulong)ppVar11 & 0xfffffffffffffffe);
            ppVar4 = ((pVar17.rbt_root)->tdata_link).rbn_right_red;
            in_R8 = (prof_tdata_t *)((ulong)ppVar4 & 0xfffffffffffffffe);
            *(prof_tdata_t **)(uVar12 + 0x18) = in_R8;
            ((pVar17.rbt_root)->tdata_link).rbn_right_red =
                 (prof_tdata_t *)((uint)ppVar4 & 1 | uVar12);
            goto LAB_00e71ccc;
          }
          ppVar13 = ((pVar17.rbt_root)->tdata_link).rbn_left;
          if ((ppVar13 == (prof_tdata_t *)0x0) ||
             (((ulong)(ppVar13->tdata_link).rbn_right_red & 1) == 0)) {
            ((pVar17.rbt_root)->tdata_link).rbn_right_red = (prof_tdata_t *)((ulong)ppVar4 | 1);
            *(byte *)(uVar12 + 0x20) = *(byte *)(uVar12 + 0x20) & 0xfe;
            pVar17 = tdatas;
            break;
          }
          in_R8 = (prof_tdata_t *)((ulong)in_R8 & 0xfffffffffffffffe);
          *(prof_tdata_t **)(uVar12 + 0x20) = in_R8;
          pppVar1 = &((pVar17.rbt_root)->tdata_link).rbn_right_red;
          *(byte *)pppVar1 = *(byte *)pppVar1 | 1;
          pppVar1 = &(ppVar13->tdata_link).rbn_right_red;
          *(byte *)pppVar1 = *(byte *)pppVar1 & 0xfe;
          ppVar4 = ((pVar17.rbt_root)->tdata_link).rbn_right_red;
          *(ulong *)(uVar12 + 0x18) = (ulong)ppVar4 & 0xfffffffffffffffe;
          ((pVar17.rbt_root)->tdata_link).rbn_right_red =
               (prof_tdata_t *)((uint)ppVar4 & 1 | uVar12);
        }
        else {
          in_R8 = *(prof_tdata_t **)(((ulong)ppVar4 & 0xfffffffffffffffe) + 0x18);
          if ((in_R8 == (prof_tdata_t *)0x0) ||
             (ppVar11 = (in_R8->tdata_link).rbn_right_red, ((ulong)ppVar11 & 1) == 0)) {
            pbVar2 = (byte *)(((ulong)ppVar4 & 0xfffffffffffffffe) + 0x20);
            *pbVar2 = *pbVar2 | 1;
            *(ulong *)(uVar12 + 0x18) =
                 (ulong)((pVar17.rbt_root)->tdata_link).rbn_right_red & 0xfffffffffffffffe;
            ((pVar17.rbt_root)->tdata_link).rbn_right_red =
                 (prof_tdata_t *)(uVar12 & 0xfffffffffffffffe);
          }
          else {
            (in_R8->tdata_link).rbn_right_red =
                 (prof_tdata_t *)((ulong)ppVar11 & 0xfffffffffffffffe);
            ppVar4 = ((pVar17.rbt_root)->tdata_link).rbn_right_red;
            ppVar13 = (prof_tdata_t *)((ulong)ppVar4 & 0xfffffffffffffffe);
            ((pVar17.rbt_root)->tdata_link).rbn_right_red =
                 (prof_tdata_t *)((uint)ppVar4 & 1 | uVar12);
            ppVar4 = (ppVar13->tdata_link).rbn_right_red;
            *(ulong *)(uVar12 + 0x18) = (ulong)ppVar4 & 0xfffffffffffffffe;
            (ppVar13->tdata_link).rbn_right_red = (prof_tdata_t *)((uint)ppVar4 & 1 | uVar12);
            ((pVar17.rbt_root)->tdata_link).rbn_right_red =
                 (prof_tdata_t *)
                 ((ulong)((uint)((pVar17.rbt_root)->tdata_link).rbn_right_red & 1) |
                 (ulong)(ppVar13->tdata_link).rbn_left);
            (ppVar13->tdata_link).rbn_left = pVar17.rbt_root;
            in_R8 = ppVar13;
          }
LAB_00e71ccc:
          pVar17.rbt_root = ppVar13;
          if ((base_t **)puVar8 == &stack0xfffffffffffff7d0) break;
        }
        if ((int)plVar16[1] < 0) {
          lVar9 = *plVar16;
          goto LAB_00e71d26;
        }
        lVar9 = *plVar16;
        goto LAB_00e71d12;
      }
      ppVar4 = (prof_tdata_t *)*puVar8;
      (ppVar4->tdata_link).rbn_left = in_R8;
      ppVar13 = (ppVar4->tdata_link).rbn_right_red;
      if (((ulong)ppVar13 & 1) != 0) {
        ppVar13 = (prof_tdata_t *)((ulong)ppVar13 & 0xfffffffffffffffe);
        ppVar11 = (ppVar13->tdata_link).rbn_left;
        if ((ppVar11 == (prof_tdata_t *)0x0) ||
           (((ulong)(ppVar11->tdata_link).rbn_right_red & 1) == 0)) {
          ppVar11 = (prof_tdata_t *)((ulong)ppVar11 | 1);
        }
        else {
          (ppVar4->tdata_link).rbn_right_red = ppVar13;
          ppVar5 = (ppVar11->tdata_link).rbn_right_red;
          (ppVar13->tdata_link).rbn_left = (prof_tdata_t *)((ulong)ppVar5 & 0xfffffffffffffffe);
          (ppVar11->tdata_link).rbn_right_red =
               (prof_tdata_t *)((ulong)((uint)ppVar5 & 1) | (ulong)ppVar13);
          ppVar13 = (prof_tdata_t *)((ulong)ppVar11 & 0xfffffffffffffffe);
          ppVar11 = (prof_tdata_t *)
                    ((ulong)((*(uint *)&(ppVar4->tdata_link).rbn_right_red | (uint)ppVar11) & 1) |
                    (ulong)(ppVar13->tdata_link).rbn_left);
        }
        (ppVar4->tdata_link).rbn_right_red = ppVar11;
        (ppVar13->tdata_link).rbn_left = ppVar4;
        if ((int)plVar16[1] < 0) {
          *(prof_tdata_t **)(*plVar16 + 0x18) = ppVar13;
          pVar17 = tdatas;
        }
        else {
          lVar9 = *plVar16;
          uVar12 = (ulong)((uint)*(undefined8 *)(lVar9 + 0x20) & 1) | (ulong)ppVar13;
LAB_00e71d80:
          *(ulong *)(lVar9 + 0x20) = uVar12;
          pVar17 = tdatas;
        }
        break;
      }
      ppVar11 = (ppVar13->tdata_link).rbn_left;
      if ((ppVar11 != (prof_tdata_t *)0x0) &&
         (in_R8 = (ppVar11->tdata_link).rbn_right_red, ((ulong)in_R8 & 1) != 0)) {
        in_R8 = (prof_tdata_t *)((ulong)in_R8 & 0xfffffffffffffffe);
        (ppVar13->tdata_link).rbn_left = in_R8;
        (ppVar11->tdata_link).rbn_right_red = ppVar13;
        pVar17.rbt_root = ppVar11 & 0xfffffffffffffffe;
        (ppVar4->tdata_link).rbn_right_red =
             (prof_tdata_t *)
             ((ulong)((*(uint *)&(ppVar4->tdata_link).rbn_right_red | (uint)ppVar11) & 1) |
             (ulong)((pVar17.rbt_root)->tdata_link).rbn_left);
        ((pVar17.rbt_root)->tdata_link).rbn_left = ppVar4;
        if ((base_t **)puVar8 != &stack0xfffffffffffff7d0) {
          lVar9 = *plVar16;
          if (-1 < (int)plVar16[1]) {
            uVar12 = (ulong)((uint)*(undefined8 *)(lVar9 + 0x20) & 1) | (ulong)pVar17.rbt_root;
            goto LAB_00e71d80;
          }
          *(prof_tdata_t **)(lVar9 + 0x18) = pVar17.rbt_root;
          pVar17 = tdatas;
        }
        break;
      }
      (ppVar4->tdata_link).rbn_right_red = (prof_tdata_t *)((ulong)ppVar11 | 1);
      (ppVar13->tdata_link).rbn_left = ppVar4;
      *puVar8 = (ulong)ppVar13;
LAB_00e71b47:
    }
  }
  else {
    *(undefined8 *)(puVar15[-4] + 0x18) = 0;
    pVar17 = tdatas;
  }
LAB_00e71d9d:
  tdatas.rbt_root = pVar17.rbt_root;
  duckdb_je_ckh_delete(tsd_00,(ckh_t *)(((rtree_ctx_t *)rtree_ctx)->cache + 3));
  if (tsd_00 == (tsd_t *)0x0) {
    prVar18 = (rtree_t *)&stack0xfffffffffffff7d0;
    duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar18);
  }
  else {
    prVar18 = (rtree_t *)&tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  rtree_read(&rStack_848,(tsdn_t *)tsd_00,prVar18,(rtree_ctx_t *)rtree_ctx,(uintptr_t)in_R8);
  key = (uintptr_t)((uint)(rStack_848.edata)->e_bits & 0xfff);
  pvVar6 = duckdb_je_arenas[key].repr;
  if (tsd_00 == (tsd_t *)0x0) {
    prVar18 = (rtree_t *)&stack0xfffffffffffff7d0;
    duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar18);
  }
  else {
    prVar18 = (rtree_t *)&tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  rVar19 = rtree_metadata_read((tsdn_t *)tsd_00,prVar18,(rtree_ctx_t *)rtree_ctx,key);
  LOCK();
  plVar16 = (long *)((long)pvVar6 + 0x48);
  *plVar16 = *plVar16 - duckdb_je_sz_index2size_tab[rVar19.szind];
  UNLOCK();
  arena_dalloc_no_tcache((tsdn_t *)tsd_00,rtree_ctx);
  return;
}

Assistant:

void
prof_reset(tsd_t *tsd, size_t lg_sample) {
	prof_tdata_t *next;

	assert(lg_sample < (sizeof(uint64_t) << 3));

	malloc_mutex_lock(tsd_tsdn(tsd), &prof_dump_mtx);
	malloc_mutex_lock(tsd_tsdn(tsd), &tdatas_mtx);

	lg_prof_sample = lg_sample;
	prof_unbias_map_init();

	next = NULL;
	do {
		prof_tdata_t *to_destroy = tdata_tree_iter(&tdatas, next,
		    prof_tdata_reset_iter, (void *)tsd);
		if (to_destroy != NULL) {
			next = tdata_tree_next(&tdatas, to_destroy);
			prof_tdata_destroy_locked(tsd, to_destroy, false);
		} else {
			next = NULL;
		}
	} while (next != NULL);

	malloc_mutex_unlock(tsd_tsdn(tsd), &tdatas_mtx);
	malloc_mutex_unlock(tsd_tsdn(tsd), &prof_dump_mtx);
}